

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pnm_test(stbi__context *s)

{
  int iVar1;
  stbi_uc *psVar2;
  bool bVar3;
  bool bVar4;
  
  psVar2 = s->img_buffer;
  if (psVar2 < s->img_buffer_end) {
LAB_00121594:
    s->img_buffer = psVar2 + 1;
    bVar4 = *psVar2 != 'P';
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar2 = s->buffer_start;
      iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
      if (iVar1 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar2;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar2;
        s->img_buffer_end = psVar2 + iVar1;
      }
      psVar2 = s->img_buffer;
      goto LAB_00121594;
    }
    bVar4 = true;
  }
  psVar2 = s->img_buffer;
  if (s->img_buffer_end <= psVar2) {
    if (s->read_from_callbacks == 0) {
      bVar3 = true;
      goto LAB_00121622;
    }
    psVar2 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar2;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar2;
      s->img_buffer_end = psVar2 + iVar1;
    }
    psVar2 = s->img_buffer;
  }
  s->img_buffer = psVar2 + 1;
  bVar3 = (byte)(*psVar2 - 0x37) < 0xfe;
LAB_00121622:
  if ((bool)(bVar4 | bVar3)) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
  }
  return (uint)!(bool)(bVar4 | bVar3);
}

Assistant:

static int      stbi__pnm_test(stbi__context *s)
{
   char p, t;
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind( s );
       return 0;
   }
   return 1;
}